

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack7_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7f;
  out[1] = *in >> 7 & 0x7f;
  out[2] = *in >> 0xe & 0x7f;
  out[3] = *in >> 0x15 & 0x7f;
  puVar1 = out + 4;
  *puVar1 = *in >> 0x1c;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 7) << 4 | *puVar1;
  out[5] = *puVar2 >> 3 & 0x7f;
  out[6] = *puVar2 >> 10 & 0x7f;
  out[7] = *puVar2 >> 0x11 & 0x7f;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack7_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;

  return in + 1;
}